

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void print_symbol(flatcc_json_printer_t *ctx,char *name,size_t len)

{
  char *pcVar1;
  
  *ctx->p = '\"';
  pcVar1 = ctx->p + (ctx->unquote == '\0');
  ctx->p = pcVar1;
  if (pcVar1 + len < ctx->pflush) {
    memcpy(pcVar1,name,len);
    pcVar1 = ctx->p + len;
    ctx->p = pcVar1;
  }
  else {
    print(ctx,name,len);
    pcVar1 = ctx->p;
  }
  *pcVar1 = '\"';
  ctx->p = ctx->p + (ctx->unquote == '\0');
  return;
}

Assistant:

static inline void print_symbol(flatcc_json_printer_t *ctx, const char *name, size_t len)
{
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
    if (ctx->p + len < ctx->pflush) {
        memcpy(ctx->p, name, len);
        ctx->p += len;
    } else {
        print(ctx, name, len);
    }
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
}